

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast.hpp
# Opt level: O1

shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> __thiscall
chaiscript::boxed_cast<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>
          (chaiscript *this,Boxed_Value *bv,Type_Conversions_State *t_conversions)

{
  element_type *peVar1;
  type_info *ptVar2;
  type_info *ptVar3;
  bool bVar4;
  undefined8 *puVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> sVar7;
  undefined1 local_78 [16];
  uint local_68;
  undefined4 uStack_64;
  pointer_____offset_0x10___ *local_60;
  pointer_____offset_0x10___ *local_58;
  undefined4 local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  
  if (t_conversions != (Type_Conversions_State *)0x0) {
    local_78._0_8_ = &std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>::typeinfo;
    local_78._8_8_ = &dispatch::Proxy_Function_Base::typeinfo;
    local_68 = 1;
    bVar4 = Type_Info::bare_equal
                      (&((bv->m_data).
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_type_info,(Type_Info *)local_78);
    if (!bVar4) {
      bVar4 = Type_Conversions::
              convertable_type<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>
                        ((t_conversions->m_conversions)._M_data);
      if (bVar4) {
        if (t_conversions == (Type_Conversions_State *)0x0) {
LAB_003d7db3:
          puVar5 = (undefined8 *)__cxa_allocate_exception(0x38);
          peVar1 = (bv->m_data).
                   super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          local_68 = (peVar1->m_type_info).m_flags;
          uStack_64 = *(undefined4 *)&(peVar1->m_type_info).field_0x14;
          ptVar2 = (peVar1->m_type_info).m_type_info;
          ptVar3 = (peVar1->m_type_info).m_bare_type_info;
          *puVar5 = &PTR__bad_cast_005a4ab0;
          local_78._0_4_ = SUB84(ptVar2,0);
          local_78._4_4_ = (undefined4)((ulong)ptVar2 >> 0x20);
          local_78._8_4_ = SUB84(ptVar3,0);
          local_78._12_4_ = (undefined4)((ulong)ptVar3 >> 0x20);
          *(undefined4 *)(puVar5 + 1) = local_78._0_4_;
          *(undefined4 *)((long)puVar5 + 0xc) = local_78._4_4_;
          *(undefined4 *)(puVar5 + 2) = local_78._8_4_;
          *(undefined4 *)((long)puVar5 + 0x14) = local_78._12_4_;
          puVar5[3] = _local_68;
          puVar5[4] = &std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>::typeinfo;
          puVar5[5] = 0x19;
          puVar5[6] = "Cannot perform boxed_cast";
          local_78._0_8_ = ptVar2;
          local_78._8_8_ = ptVar3;
          __cxa_throw(puVar5,&exception::bad_boxed_cast::typeinfo,std::bad_cast::~bad_cast);
        }
        bVar4 = Type_Conversions::
                convertable_type<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>
                          ((t_conversions->m_conversions)._M_data);
        if (!bVar4) goto LAB_003d7db3;
        local_60 = &std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>::typeinfo;
        local_58 = &dispatch::Proxy_Function_Base::typeinfo;
        local_50 = 1;
        Type_Conversions::boxed_type_conversion
                  ((Type_Conversions *)local_78,(Type_Info *)(t_conversions->m_conversions)._M_data,
                   (Conversion_Saves *)&local_60,(Boxed_Value *)(t_conversions->m_saves)._M_data);
        sVar7 = detail::
                Cast_Helper_Inner<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>
                ::cast((Boxed_Value *)this,(Type_Conversions_State *)local_78);
        _Var6 = sVar7.
                super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
          _Var6._M_pi = extraout_RDX;
        }
        goto LAB_003d7da1;
      }
    }
  }
  sVar7 = detail::
          Cast_Helper_Inner<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>::cast
                    ((Boxed_Value *)this,(Type_Conversions_State *)bv);
  _Var6 = sVar7.
          super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi;
LAB_003d7da1:
  sVar7.
  super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var6._M_pi;
  sVar7.
  super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>)
         sVar7.
         super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

decltype(auto) boxed_cast(const Boxed_Value &bv, const Type_Conversions_State *t_conversions = nullptr) {
    if (!t_conversions || bv.get_type_info().bare_equal(user_type<Type>()) || (t_conversions && !(*t_conversions)->convertable_type<Type>())) {
      try {
        return detail::Cast_Helper<Type>::cast(bv, t_conversions);
      } catch (const chaiscript::detail::exception::bad_any_cast &) {
      }
    }

    if (t_conversions && (*t_conversions)->convertable_type<Type>()) {
      try {
        // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
        // either way, we are not responsible if it doesn't work
        return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_conversion<Type>(t_conversions->saves(), bv), t_conversions));
      } catch (...) {
        try {
          // try going the other way
          return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_down_conversion<Type>(t_conversions->saves(), bv),
                                                  t_conversions));
        } catch (const chaiscript::detail::exception::bad_any_cast &) {
          throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
        }
      }
    } else {
      // If it's not convertable, just throw the error, don't waste the time on the
      // attempted dynamic_cast
      throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
    }
  }